

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3DoIncrmerge(Fts3Table *p,char *zParam)

{
  char *local_30;
  char *z;
  int local_20;
  int nMerge;
  int nMin;
  int rc;
  char *zParam_local;
  Fts3Table *p_local;
  
  local_20 = 8;
  z._4_4_ = 0;
  local_30 = zParam;
  _nMin = zParam;
  zParam_local = (char *)p;
  z._4_4_ = fts3Getint(&local_30);
  if ((*local_30 == ',') && (local_30[1] != '\0')) {
    local_30 = local_30 + 1;
    local_20 = fts3Getint(&local_30);
  }
  if ((*local_30 == '\0') && (1 < local_20)) {
    nMerge = 0;
    if (zParam_local[0x1c5] == '\0') {
      sqlite3Fts3CreateStatTable(&nMerge,(Fts3Table *)zParam_local);
    }
    if (nMerge == 0) {
      nMerge = sqlite3Fts3Incrmerge((Fts3Table *)zParam_local,z._4_4_,local_20);
    }
    sqlite3Fts3SegmentsClose((Fts3Table *)zParam_local);
  }
  else {
    nMerge = 1;
  }
  return nMerge;
}

Assistant:

static int fts3DoIncrmerge(
  Fts3Table *p,                   /* FTS3 table handle */
  const char *zParam              /* Nul-terminated string containing "A,B" */
){
  int rc;
  int nMin = (FTS3_MERGE_COUNT / 2);
  int nMerge = 0;
  const char *z = zParam;

  /* Read the first integer value */
  nMerge = fts3Getint(&z);

  /* If the first integer value is followed by a ',',  read the second
  ** integer value. */
  if( z[0]==',' && z[1]!='\0' ){
    z++;
    nMin = fts3Getint(&z);
  }

  if( z[0]!='\0' || nMin<2 ){
    rc = SQLITE_ERROR;
  }else{
    rc = SQLITE_OK;
    if( !p->bHasStat ){
      assert( p->bFts4==0 );
      sqlite3Fts3CreateStatTable(&rc, p);
    }
    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3Incrmerge(p, nMerge, nMin);
    }
    sqlite3Fts3SegmentsClose(p);
  }
  return rc;
}